

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O2

ngx_int_t ngx_radix128tree_insert(ngx_radix_tree_t *tree,u_char *key,u_char *mask,uintptr_t value)

{
  bool bVar1;
  ngx_radix_node_t *pnVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  ngx_radix_node_t *pnVar6;
  ngx_int_t nStack_50;
  
  pnVar2 = tree->root;
  lVar5 = 0;
  do {
    bVar3 = mask[lVar5];
    pnVar6 = pnVar2;
    bVar4 = 0x80;
    do {
      if ((bVar3 & bVar4) == 0) {
        pnVar2 = pnVar6;
        if (pnVar6 != (ngx_radix_node_t *)0x0) goto LAB_0011d0f7;
        goto LAB_0011d14a;
      }
      pnVar2 = (&pnVar6->right)[(key[lVar5] & bVar4) == 0];
      if (pnVar2 == (ngx_radix_node_t *)0x0) goto LAB_0011d14a;
      bVar1 = 1 < bVar4;
      pnVar6 = pnVar2;
      bVar4 = bVar4 >> 1;
    } while (bVar1);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
LAB_0011d0f7:
  if (pnVar2->value == 0xffffffffffffffff) {
LAB_0011d165:
    pnVar2->value = value;
    nStack_50 = 0;
  }
  else {
    nStack_50 = -3;
  }
  return nStack_50;
LAB_0011d14a:
  pnVar2 = pnVar6;
  if ((bVar3 & bVar4) == 0) goto LAB_0011d165;
  pnVar2 = ngx_radix_alloc(tree);
  if (pnVar2 == (ngx_radix_node_t *)0x0) {
    return -1;
  }
  pnVar2->right = (ngx_radix_node_t *)0x0;
  pnVar2->left = (ngx_radix_node_t *)0x0;
  pnVar2->parent = pnVar6;
  pnVar2->value = 0xffffffffffffffff;
  (&pnVar6->right)[(key[lVar5] & bVar4) == 0] = pnVar2;
  if (bVar4 < 2) {
    lVar5 = lVar5 + 1;
    bVar4 = 0x80;
    if (lVar5 == 0x10) goto LAB_0011d165;
  }
  else {
    bVar4 = bVar4 >> 1;
  }
  bVar3 = mask[lVar5];
  pnVar6 = pnVar2;
  goto LAB_0011d14a;
}

Assistant:

ngx_int_t
ngx_radix128tree_insert(ngx_radix_tree_t *tree, u_char *key, u_char *mask,
    uintptr_t value)
{
    u_char             bit;
    ngx_uint_t         i;
    ngx_radix_node_t  *node, *next;

    i = 0;
    bit = 0x80;

    node = tree->root;
    next = tree->root;

    while (bit & mask[i]) {
        if (key[i] & bit) {
            next = node->right;

        } else {
            next = node->left;
        }

        if (next == NULL) {
            break;
        }

        bit >>= 1;
        node = next;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    if (next) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            return NGX_BUSY;
        }

        node->value = value;
        return NGX_OK;
    }

    while (bit & mask[i]) {
        next = ngx_radix_alloc(tree);
        if (next == NULL) {
            return NGX_ERROR;
        }

        next->right = NULL;
        next->left = NULL;
        next->parent = node;
        next->value = NGX_RADIX_NO_VALUE;

        if (key[i] & bit) {
            node->right = next;

        } else {
            node->left = next;
        }

        bit >>= 1;
        node = next;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    node->value = value;

    return NGX_OK;
}